

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnOpcode(BinaryReaderIR *this,Opcode opcode)

{
  Func *pFVar1;
  _Elt_pointer puVar2;
  _Head_base<0UL,_wabt::CodeMetadataExpr_*,_false> _Var3;
  _Elt_pointer pEVar4;
  _Map_pointer ppEVar5;
  Result RVar6;
  _Elt_pointer pEVar7;
  _Head_base<0UL,_wabt::CodeMetadataExpr_*,_false> local_40;
  Location local_38;
  
  pFVar1 = this->current_func_;
  GetLocation(&local_38,this);
  pEVar7 = (this->code_metadata_queue_).entries.
           super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if (((this->code_metadata_queue_).entries.
       super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
       ._M_impl.super__Deque_impl_data._M_finish._M_cur != pEVar7) && (pEVar7->func == pFVar1)) {
    puVar2 = (pEVar7->func_queue).
             super__Deque_base<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>,_std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if ((pEVar7->func_queue).
        super__Deque_base<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>,_std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur == puVar2) {
      pEVar4 = (this->code_metadata_queue_).entries.
               super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last;
      std::
      deque<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>,_std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>_>_>
      ::~deque(&pEVar7->func_queue);
      if (pEVar7 == pEVar4 + -1) {
        operator_delete((this->code_metadata_queue_).entries.
                        super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_first,0x1b8);
        ppEVar5 = (this->code_metadata_queue_).entries.
                  super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node;
        (this->code_metadata_queue_).entries.
        super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
        ._M_impl.super__Deque_impl_data._M_start._M_node = ppEVar5 + 1;
        pEVar7 = ppEVar5[1];
        (this->code_metadata_queue_).entries.
        super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
        ._M_impl.super__Deque_impl_data._M_start._M_first = pEVar7;
        (this->code_metadata_queue_).entries.
        super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
        ._M_impl.super__Deque_impl_data._M_start._M_last = pEVar7 + 5;
      }
      else {
        pEVar7 = (this->code_metadata_queue_).entries.
                 super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
      (this->code_metadata_queue_).entries.
      super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur = pEVar7;
    }
    else {
      _Var3._M_head_impl =
           (puVar2->_M_t).
           super___uniq_ptr_impl<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::CodeMetadataExpr_*,_std::default_delete<wabt::CodeMetadataExpr>_>
           .super__Head_base<0UL,_wabt::CodeMetadataExpr_*,_false>._M_head_impl;
      if ((pEVar7->func->loc).field_1.field_1.offset +
          ((_Var3._M_head_impl)->super_ExprMixin<(wabt::ExprType)15>).super_Expr.loc.field_1.field_1
          .offset == (long)local_38.field_1.field_1.offset - 1U) {
        ((_Var3._M_head_impl)->super_ExprMixin<(wabt::ExprType)15>).super_Expr.loc.filename._M_len =
             0;
        ((_Var3._M_head_impl)->super_ExprMixin<(wabt::ExprType)15>).super_Expr.loc.filename._M_str =
             (char *)0x0;
        ((_Var3._M_head_impl)->super_ExprMixin<(wabt::ExprType)15>).super_Expr.loc.field_1.field_1.
        offset = (long)local_38.field_1.field_1.offset - 1U;
        _Var3._M_head_impl =
             (puVar2->_M_t).
             super___uniq_ptr_impl<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>
             ._M_t.
             super__Tuple_impl<0UL,_wabt::CodeMetadataExpr_*,_std::default_delete<wabt::CodeMetadataExpr>_>
             .super__Head_base<0UL,_wabt::CodeMetadataExpr_*,_false>._M_head_impl;
        (puVar2->_M_t).
        super___uniq_ptr_impl<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>.
        _M_t.
        super__Tuple_impl<0UL,_wabt::CodeMetadataExpr_*,_std::default_delete<wabt::CodeMetadataExpr>_>
        .super__Head_base<0UL,_wabt::CodeMetadataExpr_*,_false>._M_head_impl =
             (CodeMetadataExpr *)0x0;
        std::
        deque<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>,_std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>_>_>
        ::pop_front(&pEVar7->func_queue);
        if (_Var3._M_head_impl != (CodeMetadataExpr *)0x0) {
          local_40._M_head_impl = _Var3._M_head_impl;
          RVar6 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                  &local_40);
          if (local_40._M_head_impl == (CodeMetadataExpr *)0x0) {
            return (Result)RVar6.enum_;
          }
          (*((local_40._M_head_impl)->super_ExprMixin<(wabt::ExprType)15>).super_Expr._vptr_Expr[1])
                    ();
          return (Result)RVar6.enum_;
        }
      }
    }
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnOpcode(Opcode opcode) {
  std::unique_ptr<CodeMetadataExpr> metadata =
      code_metadata_queue_.pop_match(current_func_, GetLocation().offset - 1);
  if (metadata) {
    return AppendExpr(std::move(metadata));
  }
  return Result::Ok;
}